

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jieba.hpp
# Opt level: O0

void __thiscall
cppjieba::Jieba::Jieba
          (Jieba *this,string *dict_path,string *model_path,string *user_dict_path,string *idfPath,
          string *stopWordPath)

{
  string *stopWordPath_local;
  string *idfPath_local;
  string *user_dict_path_local;
  string *model_path_local;
  string *dict_path_local;
  Jieba *this_local;
  
  DictTrie::DictTrie(&this->dict_trie_,dict_path,user_dict_path,WordWeightMedian);
  HMMModel::HMMModel(&this->model_,model_path);
  MPSegment::MPSegment(&this->mp_seg_,&this->dict_trie_);
  HMMSegment::HMMSegment(&this->hmm_seg_,&this->model_);
  MixSegment::MixSegment(&this->mix_seg_,&this->dict_trie_,&this->model_);
  FullSegment::FullSegment(&this->full_seg_,&this->dict_trie_);
  QuerySegment::QuerySegment(&this->query_seg_,&this->dict_trie_,&this->model_);
  KeywordExtractor::KeywordExtractor
            (&this->extractor,&this->dict_trie_,&this->model_,idfPath,stopWordPath);
  return;
}

Assistant:

Jieba(const string& dict_path, 
        const string& model_path,
        const string& user_dict_path, 
        const string& idfPath, 
        const string& stopWordPath) 
    : dict_trie_(dict_path, user_dict_path),
      model_(model_path),
      mp_seg_(&dict_trie_),
      hmm_seg_(&model_),
      mix_seg_(&dict_trie_, &model_),
      full_seg_(&dict_trie_),
      query_seg_(&dict_trie_, &model_),
      extractor(&dict_trie_, &model_, idfPath, stopWordPath) {
  }